

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

inform_dist * inform_dist_infer(int *events,size_t n)

{
  int iVar1;
  size_t sVar2;
  inform_dist *local_38;
  inform_dist *dist;
  size_t i;
  int event;
  int b;
  size_t n_local;
  int *events_local;
  
  if ((events == (int *)0x0) || (n == 0)) {
    events_local = (int *)0x0;
  }
  else {
    i._4_4_ = -1;
    for (dist = (inform_dist *)0x0; dist < n; dist = (inform_dist *)((long)&dist->histogram + 1)) {
      iVar1 = events[(long)dist];
      if (iVar1 < 0) {
        i._4_4_ = -2;
        break;
      }
      if (i._4_4_ < iVar1) {
        i._4_4_ = iVar1;
      }
    }
    if (i._4_4_ < 0) {
      events_local = (int *)0x0;
    }
    else {
      local_38 = inform_dist_alloc((long)(i._4_4_ + 1));
      if ((local_38 != (inform_dist *)0x0) &&
         (sVar2 = inform_dist_accumulate(local_38,events,n), sVar2 != n)) {
        inform_dist_free(local_38);
        local_38 = (inform_dist *)0x0;
      }
      events_local = (int *)local_38;
    }
  }
  return (inform_dist *)events_local;
}

Assistant:

inform_dist* inform_dist_infer(int const *events, size_t n)
{
    // if no events are observed, return NULL
    if (events == NULL || n == 0) return NULL;

    // infer the support
    int b = -1, event = 0;
    for (size_t i = 0; i < n; ++i)
    {
        event = events[i];
        if (event < 0)
        {
            b = -2;
            break;
        }
        if (event > b) b = event;
    }
    if (b < 0) return NULL;
    // the base is one greater than the largest observed event
    b += 1;
    // allocate the distribution
    inform_dist *dist = inform_dist_alloc(b);
    // accumulate the observations
    if (dist != NULL)
    {
        if (inform_dist_accumulate(dist, events, n) != n)
        {
            inform_dist_free(dist);
            dist = NULL;
        }
    }
    return dist;
}